

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_re.c
# Opt level: O2

int kseq_read(kseq_t *seq)

{
  kstring_t *str;
  kstream_t *ks;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  undefined8 in_RAX;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  size_t __size;
  undefined8 uStack_38;
  
  ks = seq->f;
  uStack_38 = in_RAX;
  if (seq->last_char == 0) {
    do {
      iVar3 = ks_getc(ks);
      if (iVar3 == -1) {
        return -1;
      }
    } while ((iVar3 != 0x40) && (iVar3 != 0x3e));
    uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38);
    seq->last_char = iVar3;
  }
  (seq->qual).l = 0;
  (seq->seq).l = 0;
  (seq->comment).l = 0;
  iVar3 = ks_getuntil(ks,0,&seq->name,(int *)((long)&uStack_38 + 4));
  if (iVar3 < 0) {
    iVar3 = -1;
  }
  else {
    if (uStack_38._4_4_ != 10) {
      ks_getuntil(ks,2,&seq->comment,(int *)0x0);
    }
    if ((seq->seq).s == (char *)0x0) {
      (seq->seq).m = 0x100;
      pcVar4 = (char *)malloc(0x100);
      (seq->seq).s = pcVar4;
    }
    str = &seq->seq;
    while( true ) {
      do {
        iVar3 = ks_getc(ks);
        uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38);
      } while (iVar3 == 10);
      if ((iVar3 == -1) || (iVar3 == 0x2b)) goto LAB_00104dba;
      if ((iVar3 == 0x3e) || (iVar3 == 0x40)) break;
      sVar6 = (seq->seq).l;
      (seq->seq).l = sVar6 + 1;
      (seq->seq).s[sVar6] = (char)iVar3;
      ks_getuntil2(ks,2,str,(int *)0x0,1);
    }
    seq->last_char = iVar3;
LAB_00104dba:
    sVar6 = (seq->seq).l;
    pcVar4 = (seq->seq).s;
    uVar5 = sVar6 + 1;
    if ((seq->seq).m <= uVar5) {
      uVar5 = uVar5 >> 1 | uVar5;
      uVar5 = uVar5 >> 2 | uVar5;
      uVar5 = uVar5 >> 4 | uVar5;
      uVar5 = uVar5 >> 8 | uVar5;
      __size = (uVar5 >> 0x10 | uVar5) + 1;
      (seq->seq).m = __size;
      pcVar4 = (char *)realloc(pcVar4,__size);
      (seq->seq).s = pcVar4;
      sVar6 = (seq->seq).l;
    }
    pcVar4[sVar6] = '\0';
    if (uStack_38._4_4_ == 0x2b) {
      uVar5 = (seq->seq).m;
      if ((seq->qual).m < uVar5) {
        (seq->qual).m = uVar5;
        pcVar4 = (char *)realloc((seq->qual).s,uVar5);
        (seq->qual).s = pcVar4;
      }
      do {
        iVar3 = ks_getc(ks);
        uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38);
        if (iVar3 == -1) {
          return -2;
        }
      } while (iVar3 != 10);
      do {
        iVar3 = ks_getuntil2(ks,2,&seq->qual,(int *)0x0,1);
        uVar5 = str->l;
        uVar1 = (seq->qual).l;
        if (iVar3 < 0) break;
      } while (uVar1 < uVar5);
      seq->last_char = 0;
      uVar2 = 0xfffffffffffffffe;
      if (uVar5 == uVar1) {
        uVar2 = uVar5;
      }
      iVar3 = (int)uVar2;
    }
    else {
      iVar3 = (int)str->l;
    }
  }
  return iVar3;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_re(char *input_file, char *aStrRegex, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int count=0,l;
	int excluded = 0;
	int is_fasta = 0; /* assume fastq */
	kseq_t *seq;

	/* pcre2 variables */
	pcre2_code *re; // the regex object
	PCRE2_SIZE erroroffset;
	int errornumber;

	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp);

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); 
	kseq_rewind(seq); /* rewind to beginning for main loop */

        if (verbose_flag) {
            if (is_fasta)
                fprintf(stderr, "Input is FASTA format\n");
            else
                fprintf(stderr, "Input is FASTQ format\n");
        }

	/* initialize the re */
	re = pcre2_compile(
			aStrRegex,             /* the pattern */
			PCRE2_ZERO_TERMINATED, /* indicates pattern is zero-terminated */
			0,                     /* default options */
			&errornumber,          /* for error num */
			&erroroffset,          /* err offset */
			NULL);                 /* default compile context */

	if (re == NULL) {
		  PCRE2_UCHAR buffer[256];
		  pcre2_get_error_message(errornumber, buffer, sizeof(buffer));
		  fprintf(stderr, "PCRE2 compilation failed at offset %d: %s\n", (int)erroroffset, buffer);
		  exit(EXIT_FAILURE);
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude) {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s))
				excluded++;
			else {
				/* regex doesn't match, so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			}
		} else {
			if (search_header(re, seq->name.s) || search_header(re, seq->comment.s)) {
				/* regex matches so check size/print */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			} else
				excluded++;
		}
	} /* end of seq traversal */

	/* tear down re */
	pcre2_code_free(re); /* free up the re */

	kseq_destroy(seq);
	gzclose(fp); /* done reading file so close */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		fprintf(stdout, "Total excluded: %i\n", excluded);
	}
	return count;
}